

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.h
# Opt level: O1

void bsplib::deserial<unsigned_long>(A2A *a2a,int pid,unsigned_long *x)

{
  byte bVar1;
  pointer puVar2;
  long lVar3;
  long lVar4;
  byte *pbVar5;
  long lVar6;
  unsigned_long uVar7;
  
  lVar3 = (long)pid;
  puVar2 = (a2a->m_recv_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (byte *)((a2a->m_recv_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + puVar2[lVar3] + a2a->m_recv_cap * lVar3);
  *x = 0;
  lVar6 = 1;
  lVar4 = 0;
  uVar7 = 0;
  do {
    lVar4 = lVar4 + 0x100000000;
    bVar1 = *pbVar5;
    uVar7 = uVar7 + (ulong)(bVar1 & 0x7f) * lVar6;
    *x = uVar7;
    lVar6 = lVar6 << 7;
    pbVar5 = pbVar5 + 1;
  } while ((char)bVar1 < '\0');
  if ((ulong)(lVar4 >> 0x20) <=
      (a2a->m_recv_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar3] - puVar2[lVar3]) {
    puVar2[lVar3] = puVar2[lVar3] + (lVar4 >> 0x20);
  }
  return;
}

Assistant:

const void * recv_top( int src_pid ) const {
        std::size_t o = src_pid * m_recv_cap + m_recv_pos[src_pid];
        return static_cast< const void *>( m_recv_bufs.data() + o );
    }